

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

stbtt__buf stbtt__dict_get(stbtt__buf *b,int key)

{
  byte bVar1;
  uint in_ESI;
  stbtt__buf *in_RDI;
  stbtt__buf sVar2;
  int op;
  int end;
  int start;
  uint in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  
  stbtt__buf_seek((stbtt__buf *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc
                 );
  do {
    if (in_RDI->size <= in_RDI->cursor) {
      sVar2 = stbtt__buf_range((stbtt__buf *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),
                               in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
      return sVar2;
    }
    in_stack_ffffffffffffffe0 = in_RDI->cursor;
    while (bVar1 = stbtt__buf_peek8(in_RDI), 0x1b < bVar1) {
      stbtt__cff_skip_operand((stbtt__buf *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0));
    }
    in_stack_ffffffffffffffdc = in_RDI->cursor;
    bVar1 = stbtt__buf_get8(in_RDI);
    in_stack_ffffffffffffffd8 = (uint)bVar1;
    if (in_stack_ffffffffffffffd8 == 0xc) {
      bVar1 = stbtt__buf_get8(in_RDI);
      in_stack_ffffffffffffffd8 = bVar1 | 0x100;
    }
  } while (in_stack_ffffffffffffffd8 != in_ESI);
  sVar2 = stbtt__buf_range((stbtt__buf *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),
                           in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  return sVar2;
}

Assistant:

static stbtt__buf stbtt__dict_get(stbtt__buf *b, int key)
{
   stbtt__buf_seek(b, 0);
   while (b->cursor < b->size) {
      int start = b->cursor, end, op;
      while (stbtt__buf_peek8(b) >= 28)
         stbtt__cff_skip_operand(b);
      end = b->cursor;
      op = stbtt__buf_get8(b);
      if (op == 12)  op = stbtt__buf_get8(b) | 0x100;
      if (op == key) return stbtt__buf_range(b, start, end-start);
   }
   return stbtt__buf_range(b, 0, 0);
}